

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::OptionNotFound::OptionNotFound(OptionNotFound *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *name_local;
  OptionNotFound *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  ::std::operator+(&local_38,name," not found");
  OptionNotFound(this,&local_38,OptionNotFound);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

OptionNotFound(std::string name) : OptionNotFound(name + " not found", ExitCodes::OptionNotFound) {}